

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O1

string * __thiscall
amrex::ForkJoin::get_io_filename_abi_cxx11_
          (string *__return_storage_ptr__,ForkJoin *this,bool flag_unique)

{
  pointer pcVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined8 *puVar6;
  long *plVar7;
  uint uVar8;
  long lVar9;
  long *plVar10;
  undefined7 in_register_00000011;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string __str_2;
  string result_base;
  long *local_330;
  undefined8 local_328;
  long local_320;
  undefined8 uStack_318;
  string *local_310;
  ulong *local_308;
  long local_300;
  ulong local_2f8 [2];
  vector<int,_std::allocator<int>_> local_2e8;
  undefined4 local_2c4;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0 [2];
  long *local_2a0;
  long local_298;
  long local_290 [2];
  long *local_280 [2];
  long local_270 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  long *local_258;
  long local_250;
  long local_248 [2];
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  int aiStack_218 [20];
  ios_base local_1c8 [408];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_310 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"","");
  iVar4 = std::__cxx11::string::compare((char *)&this->task_output_dir);
  if (iVar4 != 0) {
    local_2c4 = (undefined4)CONCAT71(in_register_00000011,flag_unique);
    local_2a0 = local_290;
    pcVar1 = (this->task_output_dir)._M_dataplus._M_p;
    local_260 = &__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar1,pcVar1 + (this->task_output_dir)._M_string_length);
    local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    if (0x48 < DAT_00842950 - ParallelContext::frames) {
      lVar13 = 1;
      lVar15 = 0x50;
      do {
        local_238 = (long *)CONCAT44(local_238._4_4_,*(int *)(ParallelContext::frames + lVar15));
        if (local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_2e8,
                     (iterator)
                     local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_238);
        }
        else {
          *local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = *(int *)(ParallelContext::frames + lVar15);
          local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        lVar13 = lVar13 + 1;
        lVar9 = (DAT_00842950 - ParallelContext::frames >> 3) * -0x71c71c71c71c71c7;
        lVar15 = lVar15 + 0x48;
      } while (lVar9 - lVar13 != 0 && lVar13 <= lVar9);
    }
    local_258 = local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"-","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    if (local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start &&
        -1 < (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) {
      bVar3 = true;
      lVar13 = 0;
      do {
        if (!bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,(char *)local_258,local_250);
        }
        std::ostream::operator<<
                  ((ostream *)&local_238,
                   local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13]);
        lVar13 = lVar13 + 1;
        bVar3 = false;
      } while (lVar13 < (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x79cdcc);
    plVar7 = puVar6 + 2;
    if ((long *)*puVar6 == plVar7) {
      local_320 = *plVar7;
      uStack_318 = puVar6[3];
      local_330 = &local_320;
    }
    else {
      local_320 = *plVar7;
      local_330 = (long *)*puVar6;
    }
    local_328 = puVar6[1];
    *puVar6 = plVar7;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_330);
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    if (local_308 != local_2f8) {
      operator_delete(local_308,local_2f8[0] + 1);
    }
    if (local_258 != local_248) {
      operator_delete(local_258,local_248[0] + 1);
    }
    if (local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar16 = *(uint *)(DAT_00842950 + -0x3c);
    uVar14 = -uVar16;
    if (0 < (int)uVar16) {
      uVar14 = uVar16;
    }
    uVar12 = 1;
    if (9 < uVar14) {
      uVar11 = (ulong)uVar14;
      uVar5 = 4;
      do {
        uVar12 = uVar5;
        uVar8 = (uint)uVar11;
        if (uVar8 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_0054babe;
        }
        if (uVar8 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_0054babe;
        }
        if (uVar8 < 10000) goto LAB_0054babe;
        uVar11 = uVar11 / 10000;
        uVar5 = uVar12 + 4;
      } while (99999 < uVar8);
      uVar12 = uVar12 + 1;
    }
LAB_0054babe:
    local_330 = &local_320;
    std::__cxx11::string::_M_construct((ulong)&local_330,(char)uVar12 - (char)((int)uVar16 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar16 >> 0x1f) + (long)local_330),uVar12,uVar14);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,0x79cdd0);
    uVar2 = local_2c4;
    local_238 = &local_228;
    plVar10 = plVar7 + 2;
    if ((long *)*plVar7 == plVar10) {
      local_228 = *plVar10;
      lStack_220 = plVar7[3];
    }
    else {
      local_228 = *plVar10;
      local_238 = (long *)*plVar7;
    }
    local_230 = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_238);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    if ((char)uVar2 == '\0') {
      local_238 = &local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_2a0,local_298 + (long)local_2a0);
      std::__cxx11::string::append((char *)&local_238);
      std::__cxx11::string::operator=((string *)local_310,(string *)&local_238);
      if (local_238 != &local_228) {
        operator_delete(local_238,local_228 + 1);
      }
    }
    else {
      uVar16 = 0;
      do {
        local_308 = local_2f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,local_2a0,local_298 + (long)local_2a0);
        std::__cxx11::string::append((char *)&local_308);
        uVar14 = 1;
        if (9 < uVar16) {
          uVar11 = (ulong)uVar16;
          uVar12 = 4;
          do {
            uVar14 = uVar12;
            uVar5 = (uint)uVar11;
            if (uVar5 < 100) {
              uVar14 = uVar14 - 2;
              goto LAB_0054bc66;
            }
            if (uVar5 < 1000) {
              uVar14 = uVar14 - 1;
              goto LAB_0054bc66;
            }
            if (uVar5 < 10000) goto LAB_0054bc66;
            uVar11 = uVar11 / 10000;
            uVar12 = uVar14 + 4;
          } while (99999 < uVar5);
          uVar14 = uVar14 + 1;
        }
LAB_0054bc66:
        local_2c0 = local_2b0;
        std::__cxx11::string::_M_construct((ulong)&local_2c0,(char)uVar14);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2c0,uVar14,uVar16);
        uVar11 = 0xf;
        if (local_308 != local_2f8) {
          uVar11 = local_2f8[0];
        }
        if (uVar11 < (ulong)(local_2b8 + local_300)) {
          uVar11 = 0xf;
          if (local_2c0 != local_2b0) {
            uVar11 = local_2b0[0];
          }
          if (uVar11 < (ulong)(local_2b8 + local_300)) goto LAB_0054bcda;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_308);
        }
        else {
LAB_0054bcda:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_2c0);
        }
        plVar7 = puVar6 + 2;
        if ((long *)*puVar6 == plVar7) {
          local_320 = *plVar7;
          uStack_318 = puVar6[3];
          local_330 = &local_320;
        }
        else {
          local_320 = *plVar7;
          local_330 = (long *)*puVar6;
        }
        local_328 = puVar6[1];
        *puVar6 = plVar7;
        puVar6[1] = 0;
        *(undefined1 *)plVar7 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_330);
        plVar10 = plVar7 + 2;
        if ((long *)*plVar7 == plVar10) {
          local_228 = *plVar10;
          lStack_220 = plVar7[3];
          local_238 = &local_228;
        }
        else {
          local_228 = *plVar10;
          local_238 = (long *)*plVar7;
        }
        local_230 = plVar7[1];
        *plVar7 = (long)plVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_310,(string *)&local_238);
        if (local_238 != &local_228) {
          operator_delete(local_238,local_228 + 1);
        }
        if (local_330 != &local_320) {
          operator_delete(local_330,local_320 + 1);
        }
        if (local_2c0 != local_2b0) {
          operator_delete(local_2c0,local_2b0[0] + 1);
        }
        if (local_308 != local_2f8) {
          operator_delete(local_308,local_2f8[0] + 1);
        }
        local_280[0] = local_270;
        pcVar1 = (local_310->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_280,pcVar1,pcVar1 + local_310->_M_string_length);
        std::ifstream::ifstream(&local_238,(string *)local_280,_S_in);
        iVar4 = *(int *)((long)aiStack_218 + local_238[-3]);
        std::ifstream::~ifstream(&local_238);
        if (local_280[0] != local_270) {
          operator_delete(local_280[0],local_270[0] + 1);
        }
        uVar16 = uVar16 + 1;
      } while (iVar4 == 0);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0,local_290[0] + 1);
    }
  }
  return local_310;
}

Assistant:

std::string
ForkJoin::get_io_filename (bool flag_unique)
{
    std::string result = "";

    if (task_output_dir != "") {
        // build base filename
        std::string result_base = task_output_dir;
        result_base += "/T-" + str_join(get_frame_id_vec(), "-");
        result_base += ".R-" + std::to_string(ParallelContext::MyProcSub());

        if (flag_unique) {
            // concatenate an integer to the end to make unique
            int i = 0;
            do {
                result = result_base + ".I-" + std::to_string(i++) + ".out";
            } while (file_exists(result));
        } else {
            result = result_base + ".out";
        }
    }

    return result;
}